

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O2

plutovg_surface_t * plutovg_surface_load_from_image_file(char *filename)

{
  FILE *__stream;
  uchar *image;
  plutovg_surface_t *ppVar1;
  int in_R8D;
  long in_FS_OFFSET;
  int height;
  int width;
  int channels;
  stbi__context local_f0;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    *(char **)(in_FS_OFFSET + -8) = "can\'t fopen";
  }
  else {
    local_f0.img_buffer = local_f0.buffer_start;
    local_f0.io.eof = stbi__stdio_eof;
    local_f0.io.read = stbi__stdio_read;
    local_f0.io.skip = stbi__stdio_skip;
    local_f0.read_from_callbacks = 1;
    local_f0.buflen = 0x80;
    local_f0.callback_already_read = 0;
    local_f0.io_user_data = __stream;
    local_f0.img_buffer_original = local_f0.img_buffer;
    stbi__refill_buffer(&local_f0);
    image = stbi__load_and_postprocess_8bit(&local_f0,&width,&height,&channels,in_R8D);
    if (image != (uchar *)0x0) {
      fseek(__stream,(long)((int)local_f0.img_buffer - (int)local_f0.img_buffer_end),1);
      fclose(__stream);
      ppVar1 = plutovg_surface_load_from_image(image,width,height);
      return ppVar1;
    }
    fclose(__stream);
  }
  return (plutovg_surface_t *)0x0;
}

Assistant:

plutovg_surface_t* plutovg_surface_load_from_image_file(const char* filename)
{
    int width, height, channels;
    stbi_uc* image = stbi_load(filename, &width, &height, &channels, STBI_rgb_alpha);
    if(image == NULL)
        return NULL;
    return plutovg_surface_load_from_image(image, width, height);
}